

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_zTXt(ucvector *out,char *keyword,char *textstring,
                  LodePNGCompressSettings *zlibsettings)

{
  ucvector *out_00;
  uchar *in;
  char *in_RDX;
  char *in_RSI;
  size_t size;
  size_t keysize;
  size_t textsize;
  size_t compressedsize;
  uchar *compressed;
  uchar *chunk;
  uint error;
  LodePNGCompressSettings *in_stack_ffffffffffffff98;
  uchar *in_stack_ffffffffffffffa0;
  uchar **out_01;
  uint local_2c;
  uint local_4;
  
  out_01 = (uchar **)0x0;
  out_00 = (ucvector *)lodepng_strlen(in_RDX);
  in = (uchar *)lodepng_strlen(in_RSI);
  if ((in == (uchar *)0x0) || ((uchar *)0x4f < in)) {
    local_4 = 0x59;
  }
  else {
    local_2c = zlib_compress(out_01,(size_t *)out_00,in,(size_t)in_stack_ffffffffffffffa0,
                             in_stack_ffffffffffffff98);
    if (local_2c == 0) {
      in_stack_ffffffffffffffa0 = in + 2 + (long)out_01;
      local_2c = lodepng_chunk_init(out_01,out_00,(size_t)in,(char *)in_stack_ffffffffffffffa0);
    }
    if (local_2c == 0) {
      lodepng_memcpy((void *)0x8,in_RSI,(size_t)in);
      in[8] = '\0';
      in[9] = '\0';
      lodepng_memcpy(in + 10,(void *)0x0,(size_t)out_01);
      lodepng_chunk_generate_crc(in_stack_ffffffffffffffa0);
    }
    lodepng_free((void *)0x353895);
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

static unsigned addChunk_zTXt(ucvector* out, const char* keyword, const char* textstring,
                              LodePNGCompressSettings* zlibsettings) {
  unsigned error = 0;
  unsigned char* chunk = 0;
  unsigned char* compressed = 0;
  size_t compressedsize = 0;
  size_t textsize = lodepng_strlen(textstring);
  size_t keysize = lodepng_strlen(keyword);
  if(keysize < 1 || keysize > 79) return 89; /*error: invalid keyword size*/

  error = zlib_compress(&compressed, &compressedsize,
                        (const unsigned char*)textstring, textsize, zlibsettings);
  if(!error) {
    size_t size = keysize + 2 + compressedsize;
    error = lodepng_chunk_init(&chunk, out, size, "zTXt");
  }
  if(!error) {
    lodepng_memcpy(chunk + 8, keyword, keysize);
    chunk[8 + keysize] = 0; /*null termination char*/
    chunk[9 + keysize] = 0; /*compression method: 0*/
    lodepng_memcpy(chunk + 10 + keysize, compressed, compressedsize);
    lodepng_chunk_generate_crc(chunk);
  }

  lodepng_free(compressed);
  return error;
}